

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_partitioned_aggregate.cpp
# Opt level: O1

OperatorPartitionInfo * __thiscall
duckdb::PhysicalPartitionedAggregate::RequiredPartitionInfo
          (OperatorPartitionInfo *__return_storage_ptr__,PhysicalPartitionedAggregate *this)

{
  pointer local_28;
  pointer puStack_20;
  pointer local_18;
  
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_28,
             &(this->partitions).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  __return_storage_ptr__->batch_index = false;
  (__return_storage_ptr__->partition_columns).
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = local_28;
  (__return_storage_ptr__->partition_columns).
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = puStack_20;
  (__return_storage_ptr__->partition_columns).
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_18;
  return __return_storage_ptr__;
}

Assistant:

OperatorPartitionInfo PhysicalPartitionedAggregate::RequiredPartitionInfo() const {
	return OperatorPartitionInfo::PartitionColumns(partitions);
}